

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O0

Gia_Man_t * Abc_NtkAigToGiaTwo(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fByName)

{
  Nm_Man_t *pNVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  bool bVar7;
  int local_58;
  uint local_54;
  int Num;
  int nCommon;
  int Index;
  int i;
  Vec_Int_t *vMap2;
  Vec_Int_t *vMap1;
  Abc_Obj_t *pNode;
  Gia_Obj_t *pObj;
  Gia_Man_t *p;
  int fByName_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  Num = 0;
  iVar2 = Abc_NtkIsAigLogic(pNtk1);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsAigLogic(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress3.c"
                  ,0x7f,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  iVar2 = Abc_NtkIsAigLogic(pNtk2);
  if (iVar2 != 0) {
    if (fByName == 0) {
      iVar2 = Abc_NtkCiNum(pNtk1);
      vMap2 = Vec_IntStartNatural(iVar2);
      iVar2 = Abc_NtkCiNum(pNtk2);
      _Index = Vec_IntStartNatural(iVar2);
      iVar2 = Vec_IntSize(vMap2);
      iVar4 = Vec_IntSize(_Index);
      Num = Abc_MaxInt(iVar2,iVar4);
      iVar2 = Abc_NtkCiNum(pNtk1);
      iVar4 = Abc_NtkCiNum(pNtk2);
      uVar3 = Abc_MinInt(iVar2,iVar4);
      printf("Matched %d vars by order.",(ulong)uVar3);
      iVar2 = Abc_NtkCiNum(pNtk1);
      iVar4 = Abc_NtkCiNum(pNtk2);
      if (iVar2 < iVar4) {
        iVar2 = Abc_NtkCiNum(pNtk2);
        iVar4 = Abc_NtkCiNum(pNtk1);
        printf(" The last %d vars of Netlist2 are unmatched vars.",(ulong)(uint)(iVar2 - iVar4));
      }
      iVar2 = Abc_NtkCiNum(pNtk1);
      iVar4 = Abc_NtkCiNum(pNtk2);
      if (iVar4 < iVar2) {
        iVar2 = Abc_NtkCiNum(pNtk1);
        iVar4 = Abc_NtkCiNum(pNtk2);
        printf(" The last %d vars of Netlist1 are unmatched vars.",(ulong)(uint)(iVar2 - iVar4));
      }
      printf("\n");
    }
    else {
      local_54 = 0;
      iVar2 = Abc_NtkCiNum(pNtk1);
      vMap2 = Vec_IntStartNatural(iVar2);
      iVar2 = Abc_NtkCiNum(pNtk2);
      _Index = Vec_IntAlloc(iVar2);
      for (nCommon = 0; iVar2 = Abc_NtkCiNum(pNtk1), nCommon < iVar2; nCommon = nCommon + 1) {
        pAVar5 = Abc_NtkCi(pNtk1,nCommon);
        (pAVar5->field_6).iTemp = Num;
        Num = Num + 1;
      }
      iVar2 = Abc_NtkCiNum(pNtk1);
      if (Num != iVar2) {
        __assert_fail("Index == Abc_NtkCiNum(pNtk1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress3.c"
                      ,0x89,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
      }
      for (nCommon = 0; iVar2 = Abc_NtkCiNum(pNtk2), nCommon < iVar2; nCommon = nCommon + 1) {
        pAVar5 = Abc_NtkCi(pNtk2,nCommon);
        pNVar1 = pNtk1->pManName;
        pcVar6 = Abc_ObjName(pAVar5);
        local_58 = Nm_ManFindIdByName(pNVar1,pcVar6,2);
        if (local_58 < 0) {
          pNVar1 = pNtk1->pManName;
          pcVar6 = Abc_ObjName(pAVar5);
          local_58 = Nm_ManFindIdByName(pNVar1,pcVar6,5);
        }
        if (-1 < local_58) {
          pAVar5 = Abc_NtkObj(pNtk1,local_58);
          iVar2 = Abc_ObjIsCi(pAVar5);
          if (iVar2 == 0) {
            __assert_fail("Num < 0 || Abc_ObjIsCi(Abc_NtkObj(pNtk1, Num))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress3.c"
                          ,0x8f,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
          }
        }
        if (local_58 < 0) {
          Vec_IntPush(_Index,Num);
          Num = Num + 1;
        }
        else {
          pAVar5 = Abc_NtkObj(pNtk1,local_58);
          Vec_IntPush(_Index,(pAVar5->field_6).iTemp);
          local_54 = local_54 + 1;
        }
      }
      printf("Matched %d vars by name.",(ulong)local_54);
      uVar3 = Abc_NtkCiNum(pNtk1);
      if (local_54 != uVar3) {
        iVar2 = Abc_NtkCiNum(pNtk1);
        printf(" Netlist1 has %d unmatched vars.",(ulong)(iVar2 - local_54));
      }
      uVar3 = Abc_NtkCiNum(pNtk2);
      if (local_54 != uVar3) {
        iVar2 = Abc_NtkCiNum(pNtk2);
        printf(" Netlist2 has %d unmatched vars.",(ulong)(iVar2 - local_54));
      }
      printf("\n");
    }
    p_00 = Gia_ManStart(10000);
    pcVar6 = Abc_NtkName(pNtk1);
    pcVar6 = Abc_UtilStrsav(pcVar6);
    p_00->pName = pcVar6;
    pcVar6 = Abc_NtkSpec(pNtk1);
    pcVar6 = Abc_UtilStrsav(pcVar6);
    p_00->pSpec = pcVar6;
    for (nCommon = 0; nCommon < Num; nCommon = nCommon + 1) {
      Gia_ManAppendCi(p_00);
    }
    Gia_ManHashAlloc(p_00);
    Abc_NtkAigToGiaOne(p_00,pNtk1,vMap2);
    Abc_NtkAigToGiaOne(p_00,pNtk2,_Index);
    Gia_ManHashStop(p_00);
    Vec_IntFree(vMap2);
    Vec_IntFree(_Index);
    Gia_ManCreateValueRefs(p_00);
    nCommon = 0;
    while( true ) {
      bVar7 = false;
      if (nCommon < p_00->nObjs) {
        pNode = (Abc_Obj_t *)Gia_ManObj(p_00,nCommon);
        bVar7 = pNode != (Abc_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar2 = Gia_ObjIsAnd((Gia_Obj_t *)pNode);
      if ((iVar2 != 0) && (*(int *)&pNode->pNext == 0)) {
        iVar2 = Abc_Var2Lit(nCommon,0);
        Gia_ManAppendCo(p_00,iVar2);
      }
      nCommon = nCommon + 1;
    }
    return p_00;
  }
  __assert_fail("Abc_NtkIsAigLogic(pNtk2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress3.c"
                ,0x80,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
}

Assistant:

Gia_Man_t * Abc_NtkAigToGiaTwo( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fByName )
{
    Gia_Man_t * p;
    Gia_Obj_t * pObj;
    Abc_Obj_t * pNode;
    Vec_Int_t * vMap1, * vMap2;
    int i, Index = 0;
    assert( Abc_NtkIsAigLogic(pNtk1) );
    assert( Abc_NtkIsAigLogic(pNtk2) );
    // find common variables
    if ( fByName )
    {
        int nCommon = 0;
        vMap1 = Vec_IntStartNatural( Abc_NtkCiNum(pNtk1) );
        vMap2 = Vec_IntAlloc( Abc_NtkCiNum(pNtk2) );
        Abc_NtkForEachCi( pNtk1, pNode, i )
            pNode->iTemp = Index++;
        assert( Index == Abc_NtkCiNum(pNtk1) );
        Abc_NtkForEachCi( pNtk2, pNode, i )
        {
            int Num = Nm_ManFindIdByName( pNtk1->pManName, Abc_ObjName(pNode), ABC_OBJ_PI );
            if ( Num < 0 )
                Num = Nm_ManFindIdByName( pNtk1->pManName, Abc_ObjName(pNode), ABC_OBJ_BO );
            assert( Num < 0 || Abc_ObjIsCi(Abc_NtkObj(pNtk1, Num)) );
            if ( Num >= 0 )
                Vec_IntPush( vMap2, Abc_NtkObj(pNtk1, Num)->iTemp ), nCommon++;
            else
                Vec_IntPush( vMap2, Index++ );
        }
        // report
        printf( "Matched %d vars by name.", nCommon );
        if ( nCommon != Abc_NtkCiNum(pNtk1) )
            printf( " Netlist1 has %d unmatched vars.", Abc_NtkCiNum(pNtk1) - nCommon );
        if ( nCommon != Abc_NtkCiNum(pNtk2) )
            printf( " Netlist2 has %d unmatched vars.", Abc_NtkCiNum(pNtk2) - nCommon );
        printf( "\n" );
    }
    else
    {
        vMap1 = Vec_IntStartNatural( Abc_NtkCiNum(pNtk1) );
        vMap2 = Vec_IntStartNatural( Abc_NtkCiNum(pNtk2) );
        Index = Abc_MaxInt( Vec_IntSize(vMap1), Vec_IntSize(vMap2) );
        // report
        printf( "Matched %d vars by order.", Abc_MinInt(Abc_NtkCiNum(pNtk1), Abc_NtkCiNum(pNtk2)) );
        if ( Abc_NtkCiNum(pNtk1) < Abc_NtkCiNum(pNtk2) )
            printf( " The last %d vars of Netlist2 are unmatched vars.", Abc_NtkCiNum(pNtk2) - Abc_NtkCiNum(pNtk1) );
        if ( Abc_NtkCiNum(pNtk1) > Abc_NtkCiNum(pNtk2) )
            printf( " The last %d vars of Netlist1 are unmatched vars.", Abc_NtkCiNum(pNtk1) - Abc_NtkCiNum(pNtk2) );
        printf( "\n" );
    }
    // create new manager
    p = Gia_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( Abc_NtkName(pNtk1) );
    p->pSpec = Abc_UtilStrsav( Abc_NtkSpec(pNtk1) );
    for ( i = 0; i < Index; i++ )
        Gia_ManAppendCi(p);
    // add logic
    Gia_ManHashAlloc( p );
    Abc_NtkAigToGiaOne( p, pNtk1, vMap1 );
    Abc_NtkAigToGiaOne( p, pNtk2, vMap2 );
    Gia_ManHashStop( p );
    Vec_IntFree( vMap1 );
    Vec_IntFree( vMap2 );
    // add extra POs to dangling nodes
    Gia_ManCreateValueRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
        if ( pObj->Value == 0 )
            Gia_ManAppendCo( p, Abc_Var2Lit(i, 0) );
    return p;
}